

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rich_text.cpp
# Opt level: O0

void __thiscall
Am_Text_Mark_Data::Am_Text_Mark_Data
          (Am_Text_Mark_Data *this,Am_Rich_Text *inText,Am_Text_Index inWhere,Am_Value *inMarkData,
          bool inStickyLeft,bool inDeleteable,bool inVisible)

{
  Am_Text_Fragment *pAVar1;
  Am_Value local_50 [2];
  byte local_2b;
  byte local_2a;
  byte local_29;
  bool inVisible_local;
  bool inDeleteable_local;
  Am_Value *pAStack_28;
  bool inStickyLeft_local;
  Am_Value *inMarkData_local;
  Am_Text_Index inWhere_local;
  Am_Rich_Text *inText_local;
  Am_Text_Mark_Data *this_local;
  
  local_2b = inVisible;
  local_2a = inDeleteable;
  local_29 = inStickyLeft;
  pAStack_28 = inMarkData;
  inMarkData_local = (Am_Value *)inWhere;
  inWhere_local = (Am_Text_Index)inText;
  inText_local = (Am_Rich_Text *)this;
  Am_Wrapper::Am_Wrapper(&this->super_Am_Wrapper);
  (this->super_Am_Wrapper).super_Am_Registered_Type._vptr_Am_Registered_Type =
       (_func_int **)&PTR_ID_00411200;
  Am_Style::Am_Style(&this->mStyle);
  Am_Value::Am_Value(&this->mData);
  pAVar1 = Am_Rich_Text::Get_Fragment_At
                     ((Am_Rich_Text *)inWhere_local,(Am_Text_Index)inMarkData_local);
  this->mFragment = pAVar1;
  this->mIndex = (Am_Text_Index)inMarkData_local;
  Am_Value::Am_Value(local_50,inMarkData);
  Set_Data(this,local_50);
  Am_Value::~Am_Value(local_50);
  Set_Sticky_Left(this,(bool)(local_29 & 1));
  Set_Deleteable(this,(bool)(local_2a & 1));
  Set_Visible(this,(bool)(local_2b & 1));
  return;
}

Assistant:

Am_Text_Mark_Data::Am_Text_Mark_Data(
    const Am_Rich_Text *inText,
    Am_Text_Index inWhere, // default: 0 => create at beginning
    Am_Value inMarkData,   // default: Am_No_Value
    bool inStickyLeft,     // default: true
    bool inDeleteable,     // default: true
    bool inVisible)        // default: false
{
  mFragment = inText->Get_Fragment_At(inWhere);
  mIndex = inWhere; // temp until above works
  Set_Data(inMarkData);
  Set_Sticky_Left(inStickyLeft);
  Set_Deleteable(inDeleteable);
  Set_Visible(inVisible);
  //  mFragment->Add_Mark( this );
}